

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Expr * __thiscall Parser::primary_expression(Parser *this)

{
  uint uVar1;
  int iVar2;
  Token *pTVar3;
  pointer puVar4;
  Expr *pEVar5;
  ulong uVar6;
  long lVar7;
  Expr *pEVar8;
  pointer pTVar9;
  ulong uVar10;
  long *local_38 [2];
  long local_28 [2];
  
  pTVar3 = this->tok;
  if (pTVar3->kind == NumericConstant) {
    pEVar5 = (Expr *)operator_new(0x10);
    (pEVar5->super_Node).kind = Literal;
    (pEVar5->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00117d80;
    puVar4 = (this->lex_data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38[0] = local_28;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_38,puVar4 + pTVar3->i,puVar4 + pTVar3->j);
    lVar7 = strtol((char *)local_38[0],(char **)0x0,0);
    *(int *)&(pEVar5->super_Node).field_0xc = (int)lVar7;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
LAB_0010f78a:
    iVar2 = this->tok_i;
    uVar1 = iVar2 + 1;
    this->tok_i = uVar1;
    if (-2 < iVar2) {
      uVar6 = (ulong)uVar1;
      pTVar9 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 2) *
               -0x3333333333333333;
      if (uVar6 <= uVar10 && uVar10 - uVar6 != 0) {
        pTVar9 = pTVar9 + uVar6;
        goto LAB_0010f7ce;
      }
    }
    pTVar9 = &this->eof;
LAB_0010f7ce:
    this->tok = pTVar9;
    return pEVar5;
  }
  if (pTVar3->kind != Punctuator) {
    return (Expr *)0x0;
  }
  uVar1 = pTVar3->i;
  uVar6 = (ulong)uVar1;
  if (uVar6 < 0x2e) {
    if ((0x2c4200000000U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 != 0x28) goto LAB_0010f844;
      iVar2 = this->tok_i;
      uVar1 = iVar2 + 1;
      this->tok_i = uVar1;
      if (iVar2 < -1) {
LAB_0010f85e:
        pTVar9 = &this->eof;
      }
      else {
        uVar6 = (ulong)uVar1;
        pTVar9 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 2) *
                 -0x3333333333333333;
        if (uVar10 < uVar6 || uVar10 - uVar6 == 0) goto LAB_0010f85e;
        pTVar9 = pTVar9 + uVar6;
      }
      this->tok = pTVar9;
      pEVar5 = additive_expression(this);
      if ((this->tok->kind != Punctuator) || (this->tok->i != 0x29)) {
        error<char_const(&)[34]>(this,(char (*) [34])"expected \')\' to finish expression");
      }
      goto LAB_0010f78a;
    }
  }
  else {
LAB_0010f844:
    if (uVar1 != 0x7e) {
      return (Expr *)0x0;
    }
  }
  pEVar5 = (Expr *)operator_new(0x18);
  (pEVar5->super_Node).kind = UnaryExpr;
  (pEVar5->super_Node)._vptr_Node = (_func_int **)&PTR__UnaryExpr_00117d48;
  (pEVar5->super_Node).field_0xc = (char)uVar1;
  iVar2 = this->tok_i;
  uVar1 = iVar2 + 1;
  this->tok_i = uVar1;
  if (-2 < iVar2) {
    uVar6 = (ulong)uVar1;
    pTVar9 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 2) *
             -0x3333333333333333;
    if (uVar6 <= uVar10 && uVar10 - uVar6 != 0) {
      pTVar9 = pTVar9 + uVar6;
      goto LAB_0010f7d8;
    }
  }
  pTVar9 = &this->eof;
LAB_0010f7d8:
  this->tok = pTVar9;
  pEVar8 = primary_expression(this);
  pEVar5[1].super_Node._vptr_Node = (_func_int **)pEVar8;
  if (pEVar8 == (Expr *)0x0) {
    error<char_const(&)[38]>(this,(char (*) [38])"expected primary expression after \'-\'");
  }
  return pEVar5;
}

Assistant:

Expr* Parser::primary_expression()
{
  if (is_punctuator('(')) {
    next_token();               // Skip '('
    std::unique_ptr<Expr> e(expression());
    if (!is_punctuator(')'))
      error("expected ')' to finish expression");
    next_token();
    return e.release();
  }
  else if (is_punctuator('*') ||
           is_punctuator('&') ||
           is_punctuator('+') ||
           is_punctuator('-') ||
           is_punctuator('!') ||
           is_punctuator('~')) {
    auto be = std::make_unique<UnaryExpr>();
    be->op = tok->i;
    next_token();
    be->operand = primary_expression();
    if (!be->operand)
      error("expected primary expression after '-'");
    return be.release();
  }
  else if (is(TokenKind::NumericConstant)) {
    auto l = std::make_unique<Literal>();
    l->value = std::strtol(lex_data->id_text(*tok).c_str(), nullptr, 0);
    next_token();
    return l.release();
  }
  return nullptr;
}